

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenastring.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::ArenaStringPtr::Set(ArenaStringPtr *this,string *value,Arena *arena)

{
  string *this_00;
  
  if (((ulong)(this->tagged_ptr_).ptr_ & 3) != 0) {
    this_00 = UnsafeMutablePointer_abi_cxx11_(this);
    std::__cxx11::string::operator=((string *)this_00,(string *)value);
    return;
  }
  NewString<std::__cxx11::string>(this,arena,value);
  return;
}

Assistant:

void ArenaStringPtr::Set(std::string&& value, Arena* arena) {
  ScopedCheckPtrInvariants check(&tagged_ptr_);
  if (IsDefault()) {
    NewString(arena, std::move(value));
  } else if (IsFixedSizeArena()) {
    std::string* current = tagged_ptr_.Get();
    auto* s = new (current) std::string(std::move(value));
    arena->OwnDestructor(s);
    tagged_ptr_.SetMutableArena(s);
  } else /* !IsFixedSizeArena() */ {
    *UnsafeMutablePointer() = std::move(value);
  }
}